

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

bool __thiscall tinyusdz::Path::has_prefix(Path *this,Path *prefix)

{
  size_type sVar1;
  size_type sVar2;
  size_t __n;
  pointer pbVar3;
  pointer pbVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prim_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prefix_prim_names;
  string local_a8;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((this->_valid == true) && (prefix->_valid == true)) {
    sVar1 = (prefix->_prim_part)._M_string_length;
    sVar2 = (prefix->_prop_part)._M_string_length;
    if (sVar2 != 0 && sVar1 != 0) {
      full_path_name_abi_cxx11_(&local_88,this);
      full_path_name_abi_cxx11_(&local_a8,prefix);
      if (local_88._M_string_length == local_a8._M_string_length) {
        if (local_88._M_string_length == 0) {
          bVar9 = true;
        }
        else {
          iVar5 = bcmp(local_88._M_dataplus._M_p,local_a8._M_dataplus._M_p,local_88._M_string_length
                      );
          bVar9 = iVar5 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p == &local_88.field_2) {
        return bVar9;
      }
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      return bVar9;
    }
    if (sVar2 == 0 && sVar1 != 0) {
      sVar2 = (this->_prim_part)._M_string_length;
      if (sVar2 != 0) {
        if ((((sVar2 == 1) && (sVar1 == 1)) && (*(this->_prim_part)._M_dataplus._M_p == '/')) &&
           (*(prefix->_prim_part)._M_dataplus._M_p == '/')) {
          return true;
        }
        if (((sVar1 == 1) && (*(this->_prim_part)._M_dataplus._M_p == '/')) &&
           (*(prefix->_prim_part)._M_dataplus._M_p == '/')) {
          return true;
        }
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/","");
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar7 = 0x147ae15;
      uVar6 = 0;
      do {
        uVar6 = ::std::__cxx11::string::find_first_not_of
                          ((char *)this,(ulong)local_a8._M_dataplus._M_p,uVar6);
        if (uVar6 == 0xffffffffffffffff) break;
        uVar6 = ::std::__cxx11::string::find((char *)this,(ulong)local_a8._M_dataplus._M_p,uVar6);
        ::std::__cxx11::string::substr((ulong)&local_88,(ulong)this);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                   &local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/","");
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar7 = 0x147ae15;
      uVar6 = 0;
      do {
        uVar6 = ::std::__cxx11::string::find_first_not_of
                          ((char *)prefix,(ulong)local_a8._M_dataplus._M_p,uVar6);
        if (uVar6 == 0xffffffffffffffff) break;
        uVar6 = ::std::__cxx11::string::find((char *)prefix,(ulong)local_a8._M_dataplus._M_p,uVar6);
        ::std::__cxx11::string::substr((ulong)&local_88,(ulong)prefix);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                   &local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      pbVar4 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) ||
          (local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) ||
         (uVar6 = (long)local_48.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
         (ulong)((long)local_68.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_68.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) < uVar6)) {
LAB_00289ace:
        bVar9 = false;
      }
      else {
        lVar7 = (long)uVar6 >> 5;
        lVar8 = uVar6 - 0x18;
        do {
          __n = *(size_t *)((long)&(pbVar3->_M_dataplus)._M_p + lVar8);
          if ((__n != *(size_t *)((long)&(pbVar4->_M_dataplus)._M_p + lVar8)) ||
             ((__n != 0 &&
              (iVar5 = bcmp(*(void **)((long)pbVar3 + lVar8 + -8),
                            *(void **)((long)pbVar4 + lVar8 + -8),__n), iVar5 != 0))))
          goto LAB_00289ace;
          lVar7 = lVar7 + -1;
          lVar8 = lVar8 + -0x20;
        } while (lVar7 != 0);
        bVar9 = true;
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      return bVar9;
    }
  }
  return false;
}

Assistant:

bool Path::has_prefix(const Path &prefix) const {
  if (!is_valid() || !prefix.is_valid()) {
    return false;
  }

  if (prefix.is_prim_property_path()) {
    // No hierarchy in Prim's property path, so use ==.
    return full_path_name() == prefix.full_path_name();
  } else if (prefix.is_prim_path()) {
    // '/', prefix = '/'
    if (is_root_path() && prefix.is_root_path()) {
      // DCOUT("both are root path");
      return true;
    }

    // example:
    // - '/bora', prefix = '/'
    // - '/bora/dora', prefix = '/'
    if (is_absolute_path() && prefix.is_root_path()) {
      // DCOUT("prefix is root path");
      return true;
    }

    const std::vector<std::string> prim_names = split(prim_part(), "/");
    const std::vector<std::string> prefix_prim_names =
        split(prefix.prim_part(), "/");
    // DCOUT("prim_names = " << to_string(prim_names));
    // DCOUT("prefix.prim_names = " << to_string(prefix_prim_names));

    if (prim_names.empty() || prefix_prim_names.empty()) {
      return false;
    }

    if (prim_names.size() < prefix_prim_names.size()) {
      return false;
    }

    size_t depth = prefix_prim_names.size();
    if (depth < 1) {  // just in case
      return false;
    }

    // Move to prefix's path depth and compare each elementName of Prim tree
    // towards the root. comapre from tail would find a difference earlier.
    while (depth > 0) {
      if (prim_names[depth - 1] != prefix_prim_names[depth - 1]) {
        return false;
      }
      depth--;
    }

    // DCOUT("has_prefix");
    return true;

  } else {
    // TODO: property-only path.
    DCOUT("TODO: Unsupported Path type in has_prefix()");
    return false;
  }
}